

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O0

PrefixedLogger * __thiscall
phosg::PrefixedLogger::subf
          (PrefixedLogger *__return_storage_ptr__,PrefixedLogger *this,char *fmt,...)

{
  __va_list_tag *in_RCX;
  undefined1 local_58 [8];
  string prefix;
  va_list va;
  char *fmt_local;
  PrefixedLogger *this_local;
  
  prefix.field_2._12_4_ = 0x30;
  prefix.field_2._8_4_ = 0x18;
  string_vprintf_abi_cxx11_((string *)local_58,(phosg *)fmt,prefix.field_2._M_local_buf + 8,in_RCX);
  sub(__return_storage_ptr__,this,(string *)local_58,USE_DEFAULT);
  ::std::__cxx11::string::~string((string *)local_58);
  return __return_storage_ptr__;
}

Assistant:

PrefixedLogger PrefixedLogger::subf(const char* fmt, ...) const {
  va_list va;
  va_start(va, fmt);
  string prefix = string_vprintf(fmt, va);
  va_end(va);
  return this->sub(prefix);
}